

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSGDiscrete.cpp
# Opt level: O0

void __thiscall
POSGDiscrete::CreateNewRewardModel(POSGDiscrete *this,Index agentI,size_t nrS,size_t nrJA)

{
  reference ppRVar1;
  value_type pRVar2;
  string *in_RDI;
  size_type in_stack_ffffffffffffff38;
  vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_> *in_stack_ffffffffffffff40;
  value_type in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 uVar3;
  allocator<char> in_stack_ffffffffffffff87;
  size_t in_stack_ffffffffffffff88;
  RewardModelMapping *in_stack_ffffffffffffff90;
  allocator<char> local_41;
  string local_40 [64];
  
  if ((in_RDI[0x12]._M_string_length & 1) != 0) {
    ppRVar1 = std::vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>::at
                        (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    in_stack_ffffffffffffff70 = *ppRVar1;
    if (in_stack_ffffffffffffff70 != (value_type)0x0) {
      (*(in_stack_ffffffffffffff70->super_RewardModel).super_RewardModelDiscreteInterface.
        super_QTableInterface._vptr_QTableInterface[3])();
    }
  }
  pRVar2 = (value_type)operator_new(0x80);
  uVar3 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff87,CONCAT16(uVar3,in_stack_ffffffffffffff80)),
             (char *)in_RDI,(allocator<char> *)in_stack_ffffffffffffff70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff87,CONCAT16(uVar3,in_stack_ffffffffffffff80)),
             (char *)in_RDI,(allocator<char> *)in_stack_ffffffffffffff70);
  RewardModelMapping::RewardModelMapping
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             CONCAT17(in_stack_ffffffffffffff87,CONCAT16(uVar3,in_stack_ffffffffffffff80)),in_RDI,
             (string *)in_stack_ffffffffffffff70);
  ppRVar1 = std::vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>::at
                      (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  *ppRVar1 = pRVar2;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

void POSGDiscrete::CreateNewRewardModel
    (Index agentI, size_t nrS, size_t nrJA)
{
    if(_m_initialized)
    delete(_m_p_rModel.at(agentI));

    _m_p_rModel.at(agentI) = new RewardModelMapping( nrS, nrJA);
}